

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O3

bool __thiscall psy::C::Parser::parseExtGNU_Attribute(Parser *this,ExtGNU_AttributeSyntax **attr)

{
  SyntaxKind SVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  SyntaxToken *pSVar5;
  IndexType IVar6;
  code *pcVar7;
  ExtGNU_AttributeSyntax *pEVar8;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator_type local_31;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_30;
  SyntaxKind local_18 [4];
  
  pSVar5 = peek(this,1);
  SVar1 = pSVar5->syntaxK_;
  if (SVar1 < KeywordAlias___const) {
    if (SVar1 == IdentifierToken) {
LAB_002b70ab:
      pEVar8 = makeNode<psy::C::ExtGNU_AttributeSyntax>(this);
      *attr = pEVar8;
      IVar6 = consume(this);
      (*attr)->kwOrIdentTkIdx_ = IVar6;
      pSVar5 = peek(this,1);
      if (pSVar5->syntaxK_ != OpenParenToken) {
        return true;
      }
      IVar6 = consume(this);
      pEVar8 = *attr;
      pEVar8->openParenTkIdx_ = IVar6;
      pSVar5 = SyntaxTree::tokenAt(this->tree_,pEVar8->kwOrIdentTkIdx_);
      if (((pSVar5->field_10).identifier_ == (Identifier *)0x0) ||
         (iVar4 = strcmp(*(char **)&(((pSVar5->field_10).identifier_)->super_Lexeme).field_0x10,
                         "availability"), iVar4 != 0)) {
        pcVar7 = parseExtGNU_AttributeArguments;
      }
      else {
        pcVar7 = parseExtGNU_AttributeArgumentsLLVM;
      }
      cVar2 = (*pcVar7)(this,&(*attr)->exprs_);
      if (cVar2 == '\0') {
        return false;
      }
      bVar3 = matchOrSkipTo(this,CloseParenToken,&(*attr)->closeParenTkIdx_);
      return bVar3;
    }
    if (SVar1 != CloseParenToken) {
LAB_002b7136:
      local_18[0] = IdentifierToken;
      local_18[1] = KeywordAlias___const;
      local_18[2] = CommaToken;
      local_18[3] = CloseParenToken;
      __l._M_len = 4;
      __l._M_array = local_18;
      std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
                (&local_30,__l,&local_31);
      DiagnosticsReporter::ExpectedTokenWithin(&this->diagReporter_,&local_30);
      if (local_30.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_30.
                        super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_30.
                              super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_30.
                              super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return false;
    }
  }
  else if (SVar1 != CommaToken) {
    if (SVar1 != KeywordAlias___const) goto LAB_002b7136;
    goto LAB_002b70ab;
  }
  pEVar8 = makeNode<psy::C::ExtGNU_AttributeSyntax>(this);
  *attr = pEVar8;
  return true;
}

Assistant:

bool Parser::parseExtGNU_Attribute(ExtGNU_AttributeSyntax*& attr)
{
    DBG_THIS_RULE();

    switch (peek().kind()) {
        case SyntaxKind::IdentifierToken:
        case SyntaxKind::Keyword_const:
            attr = makeNode<ExtGNU_AttributeSyntax>();
            attr->kwOrIdentTkIdx_ = consume();
            break;

        case SyntaxKind::CommaToken:
        case SyntaxKind::CloseParenToken:
            // An empty attribute is valid.
            attr = makeNode<ExtGNU_AttributeSyntax>();
            return true;

        default:
            diagReporter_.ExpectedTokenWithin(
                { SyntaxKind::IdentifierToken,
                  SyntaxKind::Keyword_const,
                  SyntaxKind::CommaToken,
                  SyntaxKind::CloseParenToken });
            return false;
    }

    if (peek().kind() != SyntaxKind::OpenParenToken)
        return true;

    attr->openParenTkIdx_ = consume();

    auto ident = tree_->tokenAt(attr->kwOrIdentTkIdx_).identifier_;
    bool (Parser::*parseAttrArg)(ExpressionListSyntax*&);
    if (ident && !strcmp(ident->c_str(), "availability"))
        parseAttrArg = &Parser::parseExtGNU_AttributeArgumentsLLVM;
    else
        parseAttrArg = &Parser::parseExtGNU_AttributeArguments;

    return ((this->*(parseAttrArg))(attr->exprs_))
        && matchOrSkipTo(SyntaxKind::CloseParenToken, &attr->closeParenTkIdx_);
}